

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::detail::ContextScopeBase::ContextScopeBase(ContextScopeBase *this)

{
  long *in_FS_OFFSET;
  IContextScope *local_10;
  
  (this->super_IContextScope)._vptr_IContextScope = (_func_int **)&PTR__IContextScope_00150d60;
  g_infoContexts::__tls_init();
  local_10 = &this->super_IContextScope;
  std::vector<doctest::IContextScope*,std::allocator<doctest::IContextScope*>>::
  emplace_back<doctest::IContextScope*>
            ((vector<doctest::IContextScope*,std::allocator<doctest::IContextScope*>> *)
             (*in_FS_OFFSET + -0x30),&local_10);
  return;
}

Assistant:

ContextScopeBase::ContextScopeBase() {
        g_infoContexts.push_back(this);
    }